

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

void __thiscall
TPZFMatrix<long_double>::Transpose(TPZFMatrix<long_double> *this,TPZMatrix<long_double> *T)

{
  longdouble *plVar1;
  longdouble *plVar2;
  long lVar3;
  long lVar4;
  
  (*(T->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xd])
            (T,(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol,
             (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow);
  if (0 < (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol) {
    plVar1 = this->fElem;
    lVar4 = 0;
    do {
      if (0 < (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow) {
        lVar3 = 0;
        plVar2 = plVar1;
        do {
          plVar1 = plVar2 + 1;
          (*(T->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(T,lVar4,lVar3,plVar2);
          lVar3 = lVar3 + 1;
          plVar2 = plVar1;
        } while (lVar3 < (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol);
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::Transpose(TPZMatrix<TVar> *const T) const{
    T->Resize( this->Cols(), this->Rows() );
    //Transposta por filas
    TVar * p = fElem;
    for ( int64_t c = 0; c < this->Cols(); c++ ) {
        for ( int64_t r = 0; r < this->Rows(); r++ ) {
            T->PutVal( c, r, *p++ );
            //            cout<<"(r,c)= "<<r<<"  "<<c<<"\n";
        }
    }
}